

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O3

void __thiscall csv::internals::IBasicCSVParser::reset_data_ptr(IBasicCSVParser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  RawCSVData *pRVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  RawCSVData *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<csv::internals::RawCSVData,std::allocator<csv::internals::RawCSVData>>
            (a_Stack_20,&local_28,(allocator<csv::internals::RawCSVData> *)&local_29);
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  pRVar2 = local_28;
  local_28 = (RawCSVData *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->data_ptr).
            super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pRVar2;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  memcpy(&((this->data_ptr).
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parse_flags,&this->_parse_flags,0x400);
  peVar1 = (this->data_ptr).
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->_col_names).
           super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->_col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this->fields = &((this->data_ptr).
                   super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->fields;
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::reset_data_ptr() {
            this->data_ptr = std::make_shared<RawCSVData>();
            this->data_ptr->parse_flags = this->_parse_flags;
            this->data_ptr->col_names = this->_col_names;
            this->fields = &(this->data_ptr->fields);
        }